

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DESKey.cpp
# Opt level: O0

ByteString * __thiscall DESKey::getKeyCheckValue(DESKey *this)

{
  long *plVar1;
  byte bVar2;
  int iVar3;
  long lVar4;
  CryptoFactory *pCVar5;
  undefined4 extraout_var;
  uchar *__s;
  size_t __n;
  long *in_RSI;
  ByteString *in_RDI;
  SymmetricAlgorithm *cipher;
  ByteString encryptedFinal;
  ByteString data;
  ByteString iv;
  Type algo;
  ByteString *encryptedData;
  size_t in_stack_fffffffffffffea8;
  undefined1 *newSize;
  ByteString *in_stack_fffffffffffffeb0;
  ByteString *this_00;
  ByteString *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  uint uVar6;
  byte in_stack_fffffffffffffed4;
  byte in_stack_fffffffffffffed5;
  byte bVar7;
  undefined1 local_d8 [40];
  long *local_b0;
  undefined4 local_a4;
  undefined1 local_a0 [43];
  byte local_75;
  undefined1 local_68 [40];
  undefined1 local_40 [44];
  uint local_14;
  
  local_14 = 0;
  ByteString::ByteString((ByteString *)0x1a4f69);
  ByteString::ByteString((ByteString *)0x1a4f76);
  local_75 = 0;
  ByteString::ByteString((ByteString *)0x1a4f8a);
  ByteString::ByteString((ByteString *)0x1a4f99);
  lVar4 = (**(code **)(*in_RSI + 0x38))();
  if (lVar4 == 0x38) {
    local_14 = 2;
  }
  else {
    if ((lVar4 != 0x70) && (lVar4 != 0xa8)) goto LAB_001a52db;
    local_14 = 3;
  }
  pCVar5 = CryptoFactory::i();
  iVar3 = (**pCVar5->_vptr_CryptoFactory)(pCVar5,(ulong)local_14);
  local_b0 = (long *)CONCAT44(extraout_var,iVar3);
  if (local_b0 != (long *)0x0) {
    (**(code **)(*local_b0 + 0x68))();
    ByteString::resize(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    __s = ByteString::operator[](in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    __n = ByteString::size((ByteString *)0x1a511f);
    memset(__s,0,__n);
    plVar1 = local_b0;
    ByteString::ByteString((ByteString *)0x1a5151);
    newSize = local_d8;
    this_00 = (ByteString *)0x0;
    bVar2 = (**(code **)(*plVar1 + 0x10))(plVar1,in_RSI,4,local_40,0,0);
    bVar7 = 1;
    if ((bVar2 & 1) != 0) {
      in_stack_fffffffffffffed5 = (**(code **)(*local_b0 + 0x18))(local_b0,local_68,in_RDI);
      bVar7 = 1;
      if ((in_stack_fffffffffffffed5 & 1) != 0) {
        in_stack_fffffffffffffed4 = (**(code **)(*local_b0 + 0x20))(local_b0,local_a0);
        bVar7 = in_stack_fffffffffffffed4 ^ 0xff;
      }
    }
    uVar6 = CONCAT13(bVar7,(int3)in_stack_fffffffffffffed0);
    ByteString::~ByteString((ByteString *)0x1a5219);
    if ((uVar6 & 0x1000000) == 0) {
      pCVar5 = CryptoFactory::i();
      (*pCVar5->_vptr_CryptoFactory[1])(pCVar5,local_b0);
      ByteString::operator+=
                ((ByteString *)
                 CONCAT17(bVar2,CONCAT16(bVar7,CONCAT15(in_stack_fffffffffffffed5,
                                                        CONCAT14(in_stack_fffffffffffffed4,uVar6))))
                 ,in_stack_fffffffffffffec8);
      ByteString::resize(this_00,(size_t)newSize);
    }
    else {
      pCVar5 = CryptoFactory::i();
      (*pCVar5->_vptr_CryptoFactory[1])(pCVar5,local_b0);
    }
  }
LAB_001a52db:
  local_75 = 1;
  local_a4 = 1;
  ByteString::~ByteString((ByteString *)0x1a52e8);
  if ((local_75 & 1) == 0) {
    ByteString::~ByteString((ByteString *)0x1a530d);
  }
  ByteString::~ByteString((ByteString *)0x1a531a);
  ByteString::~ByteString((ByteString *)0x1a5327);
  return in_RDI;
}

Assistant:

ByteString DESKey::getKeyCheckValue() const
{
	SymAlgo::Type algo = SymAlgo::Unknown;
	ByteString iv;
	ByteString data;
	ByteString encryptedData;
	ByteString encryptedFinal;


	switch (this->getBitLen())
	{
		case 56:
			algo = SymAlgo::DES;
			break;
		case 112:
		case 168:
			algo = SymAlgo::DES3;
			break;
		default:
			return encryptedData;
	}

	SymmetricAlgorithm* cipher = CryptoFactory::i()->getSymmetricAlgorithm(algo);
	if (cipher == NULL) return encryptedData;

	// Single block of null (0x00) bytes
	data.resize(cipher->getBlockSize());
	memset(&data[0], 0, data.size());

	if (!cipher->encryptInit(this, SymMode::ECB, iv, false) ||
	    !cipher->encryptUpdate(data, encryptedData) ||
	    !cipher->encryptFinal(encryptedFinal))
	{
		CryptoFactory::i()->recycleSymmetricAlgorithm(cipher);
		return encryptedData;
	}
	CryptoFactory::i()->recycleSymmetricAlgorithm(cipher);

	encryptedData += encryptedFinal;
	encryptedData.resize(3);

	return encryptedData;
}